

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O2

void dCreate_CompRow_Matrix
               (SuperMatrix *A,int m,int n,int_t nnz,double *nzval,int_t *colind,int_t *rowptr,
               Stype_t stype,Dtype_t dtype,Mtype_t mtype)

{
  int_t *piVar1;
  char msg [256];
  
  A->Stype = stype;
  A->Dtype = dtype;
  A->Mtype = mtype;
  A->nrow = m;
  A->ncol = n;
  piVar1 = (int_t *)superlu_malloc(0x20);
  A->Store = piVar1;
  if (piVar1 == (int_t *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for A->Store",0x48,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dutil.c");
    superlu_abort_and_exit(msg);
  }
  *piVar1 = nnz;
  *(double **)(piVar1 + 2) = nzval;
  *(int_t **)(piVar1 + 4) = colind;
  *(int_t **)(piVar1 + 6) = rowptr;
  return;
}

Assistant:

void
dCreate_CompRow_Matrix(SuperMatrix *A, int m, int n, int_t nnz, 
		       double *nzval, int_t *colind, int_t *rowptr,
		       Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    NRformat *Astore;

    A->Stype = stype;
    A->Dtype = dtype;
    A->Mtype = mtype;
    A->nrow = m;
    A->ncol = n;
    A->Store = (void *) SUPERLU_MALLOC( sizeof(NRformat) );
    if ( !(A->Store) ) ABORT("SUPERLU_MALLOC fails for A->Store");
    Astore = A->Store;
    Astore->nnz = nnz;
    Astore->nzval = nzval;
    Astore->colind = colind;
    Astore->rowptr = rowptr;
}